

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

bool __thiscall QXmlStreamReaderPrivate::scanAttType(QXmlStreamReaderPrivate *this)

{
  bool bVar1;
  short tokenToInject;
  uint uVar2;
  bool bVar3;
  char **ppcVar4;
  
  uVar2 = peekChar(this);
  if (uVar2 == 0x43) {
    ppcVar4 = QXmlStreamGrammar::spell + 0x2f;
    tokenToInject = 0x2f;
LAB_003522ac:
    bVar1 = scanString(this,*ppcVar4,tokenToInject,true);
    return bVar1;
  }
  if (uVar2 == 0x45) {
    bVar1 = scanString(this,"ENTITY",0x20,true);
    bVar3 = true;
    if (!bVar1) {
      ppcVar4 = QXmlStreamGrammar::spell + 0x33;
      tokenToInject = 0x33;
      goto LAB_003522ac;
    }
  }
  else if (uVar2 == 0x4e) {
    bVar1 = scanString(this,"NOTATION",0x21,true);
    bVar3 = true;
    if (!bVar1) {
      bVar1 = scanString(this,"NMTOKEN",0x34,true);
      if (!bVar1) {
        ppcVar4 = QXmlStreamGrammar::spell + 0x35;
        tokenToInject = 0x35;
        goto LAB_003522ac;
      }
    }
  }
  else if (uVar2 == 0x49) {
    bVar1 = scanString(this,"ID",0x30,true);
    bVar3 = true;
    if (!bVar1) {
      bVar1 = scanString(this,"IDREF",0x31,true);
      if (!bVar1) {
        ppcVar4 = QXmlStreamGrammar::spell + 0x32;
        tokenToInject = 0x32;
        goto LAB_003522ac;
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool QXmlStreamReaderPrivate::scanAttType()
{
    switch (peekChar()) {
    case 'C':
        return scanString(spell[CDATA], CDATA);
    case 'I':
        if (scanString(spell[ID], ID))
            return true;
        if (scanString(spell[IDREF], IDREF))
            return true;
        return scanString(spell[IDREFS], IDREFS);
    case 'E':
        if (scanString(spell[ENTITY], ENTITY))
            return true;
        return scanString(spell[ENTITIES], ENTITIES);
    case 'N':
        if (scanString(spell[NOTATION], NOTATION))
            return true;
        if (scanString(spell[NMTOKEN], NMTOKEN))
            return true;
        return scanString(spell[NMTOKENS], NMTOKENS);
    default:
        ;
    }
    return false;
}